

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O0

ptr_t aeron::util::MemoryMappedFile::createNew(char *filename,off_t offset,size_t size)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  IOException *this;
  string *function;
  shared_ptr<aeron::util::MemoryMappedFile> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_RSI;
  element_type *in_RDI;
  ptr_t pVar4;
  OnScopeExit tidy;
  FileHandle fd;
  MemoryMappedFile *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  int line;
  string *in_stack_fffffffffffffe18;
  string *file;
  string *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  string *what;
  IOException *in_stack_fffffffffffffe30;
  uint8_t in_stack_fffffffffffffe47;
  size_t in_stack_fffffffffffffe48;
  allocator *paVar5;
  FileHandle in_stack_fffffffffffffe50;
  undefined1 local_179 [33];
  size_t in_stack_fffffffffffffea8;
  off_t in_stack_fffffffffffffeb0;
  MemoryMappedFile *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec4;
  allocator local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  int local_e4;
  int *local_e0;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24 [5];
  char *local_10;
  
  line = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  local_10 = in_RSI;
  local_24[0] = open64(in_RSI,0x42,0x1b6);
  if (local_24[0] < 0) {
    local_ca = 1;
    uVar2 = __cxa_allocate_exception(0x48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"failed to create file: ",&local_69);
    std::operator+(&local_48,&local_68,local_10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::createNew(const char *, off_t, size_t)"
               ,&local_a1);
    pcVar3 = past_prefix((char *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    paVar5 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,pcVar3,paVar5);
    IOException::IOException
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18,line);
    local_ca = 0;
    __cxa_throw(uVar2,&IOException::typeinfo,IOException::~IOException);
  }
  local_e0 = local_24;
  OnScopeExit::
  OnScopeExit<aeron::util::MemoryMappedFile::createNew(char_const*,long,unsigned_long)::__0>
            ((OnScopeExit *)in_stack_fffffffffffffe30,
             (anon_class_8_1_3fcf657c_for_f *)in_stack_fffffffffffffe28);
  local_e4 = local_24[0];
  bVar1 = fill(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe47);
  if (!bVar1) {
    this = (IOException *)__cxa_allocate_exception(0x48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"failed to write to file: ",&local_129);
    std::operator+(&local_108,&local_128,local_10);
    what = (string *)&stack0xfffffffffffffeaf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffeb0,
               "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::createNew(const char *, off_t, size_t)"
               ,(allocator *)what);
    function = (string *)
               past_prefix((char *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    file = (string *)local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_179 + 1),(char *)function,(allocator *)file);
    IOException::IOException(this,what,function,file,line);
    __cxa_throw(this,&IOException::typeinfo,IOException::~IOException);
  }
  this_00 = (shared_ptr<aeron::util::MemoryMappedFile> *)operator_new(0x10);
  MemoryMappedFile(in_stack_fffffffffffffeb8,(FileHandle)in_stack_fffffffffffffec4,
                   in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::shared_ptr<aeron::util::MemoryMappedFile>::shared_ptr<aeron::util::MemoryMappedFile,void>
            (this_00,in_stack_fffffffffffffe08);
  OnScopeExit::~OnScopeExit((OnScopeExit *)0x1ef797);
  pVar4.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar4.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (ptr_t)pVar4.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MemoryMappedFile::ptr_t MemoryMappedFile::createNew(const char *filename, off_t offset, size_t size)
{
    FileHandle fd;
    fd.handle = open(filename, O_RDWR|O_CREAT, 0666);

    if (fd.handle < 0)
    {
        throw IOException(std::string("failed to create file: ") + filename, SOURCEINFO);
    }

    OnScopeExit tidy([&]()
    {
        close(fd.handle);
    });

    if (!fill(fd, size, 0))
    {
        throw IOException(std::string("failed to write to file: ") + filename, SOURCEINFO);
    }

    return MemoryMappedFile::ptr_t(new MemoryMappedFile(fd, offset, size));
}